

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResultToJUnit.cpp
# Opt level: O0

void batchResultToJUnitReport(char *batchResultFilename,char *dstFileName)

{
  pointer *dst;
  deBool dVar1;
  Error *this;
  Writer *pWVar2;
  byte local_69d;
  BeginElement local_690;
  BeginElement local_670;
  undefined1 local_650 [8];
  TestLogParser parser;
  ResultToJUnitHandler handler;
  undefined1 local_398 [8];
  Writer writer;
  ofstream out;
  char *dstFileName_local;
  char *batchResultFilename_local;
  
  dst = &writer.m_elementStack.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::ofstream::ofstream(dst,dstFileName,_S_bin);
  xe::xml::Writer::Writer((Writer *)local_398,(ostream *)dst);
  ResultToJUnitHandler::ResultToJUnitHandler
            ((ResultToJUnitHandler *)&parser.m_inSession,(Writer *)local_398);
  xe::TestLogParser::TestLogParser((TestLogParser *)local_650,(TestLogHandler *)&parser.m_inSession)
  ;
  while( true ) {
    dVar1 = deGetFalse();
    local_69d = 0;
    if (dVar1 == 0) {
      local_69d = std::ios::good();
    }
    if ((local_69d & 1) == 0) break;
    dVar1 = deGetFalse();
    if (dVar1 == 0) {
      std::operator<<((ostream *)
                      &writer.m_elementStack.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      "<?xml version=\"1.0\" encoding=\"utf-8\"?>\n");
      xe::xml::Writer::BeginElement::BeginElement(&local_670,"testsuites");
      pWVar2 = xe::xml::Writer::operator<<((Writer *)local_398,&local_670);
      xe::xml::Writer::BeginElement::BeginElement(&local_690,"testsuite");
      xe::xml::Writer::operator<<(pWVar2,&local_690);
      xe::xml::Writer::BeginElement::~BeginElement(&local_690);
      xe::xml::Writer::BeginElement::~BeginElement(&local_670);
      parseBatchResult((TestLogParser *)local_650,batchResultFilename);
      pWVar2 = xe::xml::Writer::operator<<
                         ((Writer *)local_398,(EndElementType *)&xe::xml::Writer::EndElement);
      xe::xml::Writer::operator<<(pWVar2,(EndElementType *)&xe::xml::Writer::EndElement);
      xe::TestLogParser::~TestLogParser((TestLogParser *)local_650);
      ResultToJUnitHandler::~ResultToJUnitHandler((ResultToJUnitHandler *)&parser.m_inSession);
      xe::xml::Writer::~Writer((Writer *)local_398);
      std::ofstream::~ofstream
                (&writer.m_elementStack.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return;
    }
  }
  this = (Error *)__cxa_allocate_exception(0x10);
  xe::Error::Error(this,(char *)0x0,"out.good()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/tools/xeBatchResultToJUnit.cpp"
                   ,0x8f);
  __cxa_throw(this,&xe::Error::typeinfo,xe::Error::~Error);
}

Assistant:

static void batchResultToJUnitReport (const char* batchResultFilename, const char* dstFileName)
{
	std::ofstream				out			(dstFileName, std::ios_base::binary);
	xe::xml::Writer				writer		(out);
	ResultToJUnitHandler		handler		(writer);
	xe::TestLogParser			parser		(&handler);

	XE_CHECK(out.good());

	out << "<?xml version=\"1.0\" encoding=\"utf-8\"?>\n";

	writer << xe::xml::Writer::BeginElement("testsuites")
		   << xe::xml::Writer::BeginElement("testsuite");

	// Parse and write individual cases
	parseBatchResult(parser, batchResultFilename);

	writer << xe::xml::Writer::EndElement << xe::xml::Writer::EndElement;
}